

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O1

void beltWBLStepEOpt(void *buf,size_t count,void *state)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  *(undefined8 *)((long)state + 0x30) = *buf;
  uVar2 = *(ulong *)((long)buf + 8);
  *(ulong *)((long)state + 0x38) = uVar2;
  if (0x20 < count) {
    uVar3 = *(ulong *)((long)state + 0x30);
    uVar4 = 0x20;
    do {
      uVar3 = uVar3 ^ *(ulong *)((long)buf + (uVar4 - 0x10));
      *(ulong *)((long)state + 0x30) = uVar3;
      uVar2 = uVar2 ^ *(ulong *)((long)buf + (uVar4 - 8));
      *(ulong *)((long)state + 0x38) = uVar2;
      uVar4 = uVar4 + 0x10;
    } while (uVar4 < count);
  }
  uVar2 = 0;
  do {
    *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)state + 0x30);
    *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)state + 0x38);
    beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
    *(long *)((long)state + 0x40) = *(long *)((long)state + 0x40) + 1;
    memXor2((octet *)((long)state + 0x20),(void *)((long)state + 0x40),8);
    uVar4 = ((count - 0x10) + uVar2) % count;
    *(ulong *)((long)buf + uVar4) = *(ulong *)((long)buf + uVar4) ^ *(ulong *)((long)state + 0x20);
    puVar1 = (ulong *)((long)buf + uVar4 + 8);
    *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x28);
    uVar3 = *(ulong *)((long)state + 0x30);
    *(ulong *)((long)state + 0x20) = uVar3;
    *(ulong *)((long)state + 0x28) = *(ulong *)((long)state + 0x38);
    uVar5 = *(ulong *)((long)buf + uVar4) ^ uVar3;
    *(ulong *)((long)state + 0x30) = uVar5;
    uVar4 = *(ulong *)((long)state + 0x38) ^ *(ulong *)((long)buf + uVar4 + 8);
    *(ulong *)((long)state + 0x38) = uVar4;
    *(ulong *)((long)state + 0x30) = uVar5 ^ *(ulong *)((long)buf + uVar2);
    *(ulong *)((long)state + 0x38) = uVar4 ^ *(ulong *)((long)buf + uVar2 + 8);
    *(ulong *)((long)buf + uVar2) = uVar3;
    *(undefined8 *)((long)buf + uVar2 + 8) = *(undefined8 *)((long)state + 0x28);
    uVar2 = (uVar2 + 0x10) % count;
  } while (*(ulong *)((long)state + 0x40) % (count + 0xf >> 3 & 0xfffffffffffffffe) != 0);
  return;
}

Assistant:

void beltWBLStepEOpt(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	size_t i;
	ASSERT(count >= 32 && count % 16 == 0);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	// sum <- r1 + ... + r_{n-1}
	beltBlockCopy(st->sum, buf);
	for (i = 16; i + 16 < count; i += 16)
		beltBlockXor2(st->sum, (octet*)buf + i);
	// 2 * n итераций 
	ASSERT(st->round % (2 * n) == 0);
	// sum будет записываться по смещению i: 
	// это блок r1 в начале такта и блок r* в конце)
	i = 0; 
	do
	{
		// block <- beltBlockEncr(sum) + <round>
		beltBlockCopy(st->block, st->sum);
		beltBlockEncr(st->block, st->key);
		st->round++;
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + (i + count - 16) % count, st->block);
		// запомнить sum
		beltBlockCopy(st->block, st->sum);
		// пересчитать sum: добавить новое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + (i + count - 16) % count);
		// пересчитать sum: исключить старое слагаемое
		beltBlockXor2(st->sum, (octet*)buf + i);
		// сохранить sum
		beltBlockCopy((octet*)buf + i, st->block);
		// вперед
		i = (i + 16) % count;
	}
	while (st->round % (2 * n));
}